

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObservers.cpp
# Opt level: O0

void __thiscall StatsObserver::update(StatsObserver *this)

{
  int iVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar2;
  size_type sVar3;
  GameLoop *this_00;
  Map *this_01;
  size_type sVar4;
  ostream *poVar5;
  int playerId;
  bool gameDone;
  StatsObserver *this_local;
  
  pvVar2 = Player::getOwnedCountries(this->subject);
  sVar3 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar2);
  this_00 = GameLoop::getInstance();
  this_01 = GameLoop::getGameMap(this_00);
  pvVar2 = Map::getMapCountries(this_01);
  sVar4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar2);
  if (sVar3 == sVar4) {
    iVar1 = Player::getPlayerId(this->subject);
    std::operator<<((ostream *)&std::cout,"\x1b[1m\x1b[33m");
    poVar5 = std::operator<<((ostream *)&std::cout,"Player ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
    std::operator<<(poVar5," owns all of the countries! They have won the game!!");
  }
  else {
    printTable();
  }
  return;
}

Assistant:

void StatsObserver::update() {
    bool gameDone = false;
    int playerId = 0;

    if (this->subject->getOwnedCountries()->size() ==
        GameLoop::getInstance()->getGameMap()->getMapCountries()->size()) {
        gameDone = true;
        playerId = this->subject->getPlayerId();
    }
    if (gameDone) {
        cout << "\033[1m\033[33m";
        std::cout << "Player " << playerId << " owns all of the countries! They have won the game!!";
    } else {
        StatsObserver::printTable();
    }
}